

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre.h
# Opt level: O2

Matcher * __thiscall
trivialre::re_compiler::C<StringTestingBuilder,_trivialre::re_compiler::ErrorPolicy>::MaybeSeq
          (Matcher *__return_storage_ptr__,
          C<StringTestingBuilder,_trivialre::re_compiler::ErrorPolicy> *this,Matcher *left,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *right)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Matcher local_58;
  Matcher local_38;
  
  if ((right->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    std::__cxx11::string::string((string *)&local_38,(string *)left);
    pbVar1 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(right);
    std::__cxx11::string::string((string *)&local_58,(string *)pbVar1);
    StringTestingBuilder::Seq(__return_storage_ptr__,&local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)left);
  }
  return __return_storage_ptr__;
}

Assistant:

Matcher MaybeSeq(Matcher left, std::optional<Matcher> right) {
    if (right) {
      return builder.Seq(std::move(left), std::move(right.value()));
    }
    return left;
  }